

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::MultipleBindingCase::MultipleBindingCase
          (MultipleBindingCase *this,Context *ctx,char *name,int flags)

{
  TestSpec TVar1;
  char *desc;
  string local_48;
  int local_24;
  char *pcStack_20;
  int flags_local;
  char *name_local;
  Context *ctx_local;
  MultipleBindingCase *this_local;
  
  (this->super_BindingRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MultipleBindingCase_032c8e88;
  local_24 = flags;
  pcStack_20 = name;
  name_local = (char *)ctx;
  ctx_local = (Context *)this;
  Functional::(anonymous_namespace)::MultipleBindingCase::genTestDescription_abi_cxx11_
            (&local_48,this,flags);
  desc = (char *)std::__cxx11::string::c_str();
  BindingRenderCase::BindingRenderCase(&this->super_BindingRenderCase,ctx,name,desc,false);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_BindingRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MultipleBindingCase_032c8e88;
  TVar1 = genTestSpec(this,local_24);
  (this->m_spec).zeroStride = (bool)(char)TVar1._0_2_;
  (this->m_spec).instanced = (bool)(char)((ushort)TVar1._0_2_ >> 8);
  (this->m_spec).aliasingBuffers = TVar1.aliasingBuffers;
  this->m_primitiveBuf = 0;
  this->m_colorOffsetBuf = 0;
  return;
}

Assistant:

MultipleBindingCase::MultipleBindingCase (Context& ctx, const char* name, int flags)
	: BindingRenderCase	(ctx, name, genTestDescription(flags).c_str(), false)
	, m_spec			(genTestSpec(flags))
	, m_primitiveBuf	(0)
	, m_colorOffsetBuf	(0)
{
	DE_ASSERT(!(m_spec.instanced && m_spec.zeroStride));
}